

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

Format __thiscall QRasterBuffer::prepare(QRasterBuffer *this,QImage *image)

{
  int iVar1;
  Format FVar2;
  QRgb QVar3;
  QRgb QVar4;
  uchar *puVar5;
  int *piVar6;
  QImageData *pQVar7;
  qsizetype qVar8;
  QImage *in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  QList<unsigned_int> colorTable;
  QImage *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  bool bVar9;
  undefined1 in_stack_ffffffffffffffa7;
  byte bVar10;
  QList<unsigned_int> local_30;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = QImage::bits(in_stack_ffffffffffffff88);
  *(uchar **)&in_RDI[2].super_QPaintDevice.painters = puVar5;
  local_c = QImage::width(in_RSI);
  piVar6 = qMin<int>(&QT_RASTER_COORD_LIMIT,&local_c);
  *(int *)&in_RDI[1].super_QPaintDevice.painters = *piVar6;
  local_10 = QImage::height(in_RSI);
  piVar6 = qMin<int>(&QT_RASTER_COORD_LIMIT,&local_10);
  *(int *)&in_RDI[1].super_QPaintDevice.field_0xc = *piVar6;
  iVar1 = QImage::depth(in_RSI);
  *(int *)&in_RDI[2].super_QPaintDevice._vptr_QPaintDevice = iVar1 / 8;
  pQVar7 = (QImageData *)QImage::bytesPerLine(in_RSI);
  in_RDI[1].d = pQVar7;
  FVar2 = QImage::format(in_RSI);
  *(Format *)&in_RDI->d = FVar2;
  QImage::colorSpace(in_RDI);
  QColorSpace::operator=
            ((QColorSpace *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
             (QColorSpace *)in_RDI);
  QColorSpace::~QColorSpace((QColorSpace *)0x5602aa);
  iVar1 = QImage::depth(in_RSI);
  bVar10 = 0;
  bVar9 = false;
  if (iVar1 == 1) {
    QImage::colorTable(in_RDI);
    bVar10 = 1;
    qVar8 = QList<unsigned_int>::size(&local_30);
    bVar9 = qVar8 == 2;
  }
  QVar4 = CONCAT13(bVar9,(int3)in_stack_ffffffffffffff94);
  if ((bVar10 & 1) != 0) {
    QList<unsigned_int>::~QList((QList<unsigned_int> *)0x56030a);
  }
  if ((QVar4 & 0x1000000) != 0) {
    *(undefined1 *)&(in_RDI->super_QPaintDevice)._vptr_QPaintDevice = 1;
    QImage::colorTable(in_RDI);
    QList<unsigned_int>::operator[]
              ((QList<unsigned_int> *)CONCAT44(QVar4,in_stack_ffffffffffffff90),
               (qsizetype)in_stack_ffffffffffffff88);
    QVar3 = qPremultiply(QVar4);
    *(QRgb *)((long)&(in_RDI->super_QPaintDevice)._vptr_QPaintDevice + 4) = QVar3;
    QList<unsigned_int>::operator[]
              ((QList<unsigned_int> *)CONCAT44(QVar4,in_stack_ffffffffffffff90),
               (qsizetype)in_stack_ffffffffffffff88);
    QVar4 = qPremultiply(QVar4);
    *(QRgb *)&(in_RDI->super_QPaintDevice).painters = QVar4;
    QList<unsigned_int>::~QList((QList<unsigned_int> *)0x56039b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(Format *)&in_RDI->d;
}

Assistant:

QImage::Format QRasterBuffer::prepare(QImage *image)
{
    m_buffer = (uchar *)image->bits();
    m_width = qMin(QT_RASTER_COORD_LIMIT, image->width());
    m_height = qMin(QT_RASTER_COORD_LIMIT, image->height());
    bytes_per_pixel = image->depth()/8;
    bytes_per_line = image->bytesPerLine();

    format = image->format();
    colorSpace = image->colorSpace();
    if (image->depth() == 1 && image->colorTable().size() == 2) {
        monoDestinationWithClut = true;
        const QList<QRgb> colorTable = image->colorTable();
        destColor0 = qPremultiply(colorTable[0]);
        destColor1 = qPremultiply(colorTable[1]);
    }

    return format;
}